

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::Func::Call
          (Func *this,Store *store,Values *params,Values *results,Ptr *out_trap,Stream *trace_stream
          )

{
  Enum EVar1;
  Ptr thread;
  RefPtr<wabt::interp::Thread> local_58;
  Options local_38;
  
  local_38.value_stack_size = 0xaaa;
  local_38.call_stack_size = 0x800;
  local_38.trace_stream = trace_stream;
  Store::Alloc<wabt::interp::Thread,wabt::interp::Store&,wabt::interp::Thread::Options_const&>
            (&local_58,store,store,&local_38);
  EVar1 = (*(this->super_Extern).super_Object._vptr_Object[5])
                    (this,local_58.obj_,params,results,out_trap);
  if (local_58.obj_ != (Thread *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_58.store_)->roots_,local_58.root_index_);
  }
  return (Result)EVar1;
}

Assistant:

Result Func::Call(Store& store,
                  const Values& params,
                  Values& results,
                  Trap::Ptr* out_trap,
                  Stream* trace_stream) {
  Thread::Options options;
  options.trace_stream = trace_stream;
  Thread::Ptr thread = Thread::New(store, options);
  return DoCall(*thread, params, results, out_trap);
}